

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O0

QSize __thiscall QToolBarAreaLayout::minimumSize(QToolBarAreaLayout *this,QSize *centerMin)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  QSize *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  QSize bottom_min;
  QSize top_min;
  QSize right_min;
  QSize left_min;
  QSize result;
  int in_stack_ffffffffffffff7c;
  QSize *in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  QSize local_30;
  QSize local_28;
  QSize local_20;
  QSize local_18;
  QSize local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(byte *)(in_RDI + 0xf8) & 1) == 0) {
    local_10 = *in_RSI;
  }
  else {
    local_10 = *in_RSI;
    local_18 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
    local_18 = QToolBarAreaLayoutInfo::minimumSize
                         ((QToolBarAreaLayoutInfo *)
                          CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    local_20 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
    local_20 = QToolBarAreaLayoutInfo::minimumSize
                         ((QToolBarAreaLayoutInfo *)
                          CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    local_28 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
    local_28 = QToolBarAreaLayoutInfo::minimumSize
                         ((QToolBarAreaLayoutInfo *)
                          CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    local_30 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
    local_30 = QToolBarAreaLayoutInfo::minimumSize
                         ((QToolBarAreaLayoutInfo *)
                          CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    local_34 = QSize::width((QSize *)0x6f2b69);
    local_38 = QSize::width((QSize *)0x6f2b77);
    qMax<int>(&local_34,&local_38);
    QSize::setWidth(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
    local_3c = QSize::width((QSize *)0x6f2ba0);
    local_40 = QSize::width((QSize *)0x6f2bae);
    qMax<int>(&local_3c,&local_40);
    QSize::setWidth(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
    local_44 = QSize::height((QSize *)0x6f2bd7);
    local_48 = QSize::height((QSize *)0x6f2be5);
    qMax<int>(&local_44,&local_48);
    QSize::setHeight(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
    QSize::height((QSize *)0x6f2c0e);
    QSize::height((QSize *)0x6f2c1c);
    qMax<int>((int *)&stack0xffffffffffffffb4,(int *)&stack0xffffffffffffffb0);
    QSize::setHeight(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
    iVar1 = QSize::width((QSize *)0x6f2c45);
    iVar2 = QSize::width((QSize *)0x6f2c53);
    piVar3 = QSize::rwidth((QSize *)0x6f2c69);
    *piVar3 = iVar1 + iVar2 + *piVar3;
    iVar1 = QSize::height((QSize *)0x6f2c7b);
    iVar2 = QSize::height((QSize *)0x6f2c89);
    piVar3 = QSize::rheight((QSize *)0x6f2c9f);
    *piVar3 = iVar1 + iVar2 + *piVar3;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_10;
  }
  __stack_chk_fail();
}

Assistant:

QSize QToolBarAreaLayout::minimumSize(const QSize &centerMin) const
{
    if (!visible)
        return centerMin;

    QSize result = centerMin;

    QSize left_min = docks[QInternal::LeftDock].minimumSize();
    QSize right_min = docks[QInternal::RightDock].minimumSize();
    QSize top_min = docks[QInternal::TopDock].minimumSize();
    QSize bottom_min = docks[QInternal::BottomDock].minimumSize();

    result.setWidth(qMax(top_min.width(), result.width()));
    result.setWidth(qMax(bottom_min.width(), result.width()));
    result.setHeight(qMax(left_min.height(), result.height()));
    result.setHeight(qMax(right_min.height(), result.height()));

    result.rwidth() += left_min.width() + right_min.width();
    result.rheight() += top_min.height() + bottom_min.height();

    return result;
}